

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_write_binary_le(mbedtls_mpi *X,uchar *buf,size_t buflen)

{
  size_t sVar1;
  ulong uVar2;
  size_t __n;
  ulong uVar3;
  byte bVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  
  sVar1 = X->n;
  uVar2 = sVar1 * 8;
  uVar3 = uVar2;
  if ((buflen <= uVar2) && (uVar3 = buflen, buflen < uVar2)) {
    lVar5 = buflen * 8;
    sVar6 = buflen;
    do {
      if ((char)(*(ulong *)((long)X->p + (sVar6 & 0xfffffffffffffff8)) >> ((byte)lVar5 & 0x38)) !=
          '\0') {
        return -8;
      }
      sVar6 = sVar6 + 1;
      lVar5 = lVar5 + 8;
    } while (uVar2 != sVar6);
  }
  if (uVar3 != 0) {
    bVar4 = 0;
    uVar7 = 0;
    do {
      buf[uVar7] = (uchar)(*(ulong *)((long)X->p + (uVar7 & 0xfffffffffffffff8)) >> (bVar4 & 0x38));
      uVar7 = uVar7 + 1;
      bVar4 = bVar4 + 8;
    } while (uVar3 != uVar7);
  }
  __n = buflen + sVar1 * -8;
  if (uVar2 <= buflen && __n != 0) {
    memset(buf + uVar2,0,__n);
  }
  return 0;
}

Assistant:

int mbedtls_mpi_write_binary_le( const mbedtls_mpi *X,
                                 unsigned char *buf, size_t buflen )
{
    size_t stored_bytes = X->n * ciL;
    size_t bytes_to_copy;
    size_t i;

    if( stored_bytes < buflen )
    {
        bytes_to_copy = stored_bytes;
    }
    else
    {
        bytes_to_copy = buflen;

        /* The output buffer is smaller than the allocated size of X.
         * However X may fit if its leading bytes are zero. */
        for( i = bytes_to_copy; i < stored_bytes; i++ )
        {
            if( GET_BYTE( X, i ) != 0 )
                return( MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL );
        }
    }

    for( i = 0; i < bytes_to_copy; i++ )
        buf[i] = GET_BYTE( X, i );

    if( stored_bytes < buflen )
    {
        /* Write trailing 0 bytes */
        memset( buf + stored_bytes, 0, buflen - stored_bytes );
    }

    return( 0 );
}